

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::extreme_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  lzdecision *plVar4;
  uint *puVar5;
  uint *in_RSI;
  state *in_RDI;
  node_state *cur_node_state_1;
  node *cur_node;
  lzdecision *pDst_dec;
  int node_index;
  uint i_1;
  node_state *pLast_node_states;
  int node_state_index;
  bit_cost_t lowest_final_cost;
  uint lit_total_complexity;
  bit_cost_t lit_total_cost;
  bit_cost_t lit_cost;
  uint match_total_complexity;
  bit_cost_t match_total_cost;
  node *dst_node_1;
  uint match_complexity;
  uint l_1;
  uint match_dist;
  uint start_len;
  uint end_len;
  uint full_match_index;
  uint prev_max_match_len;
  bit_cost_t actual_cost;
  lzdecision lzdec;
  uint min_truncate_match_len;
  bit_cost_t rep_match_total_cost;
  node *dst_node;
  uint l;
  uint rep_match_total_complexity;
  uint8 *pComp;
  uint comp_pos;
  uint dist;
  uint hist_match_len;
  uint rep_match_index;
  uint match_hist_min_match_len;
  uint match_hist_max_len;
  uint cur_node_total_complexity;
  bit_cost_t cur_node_total_cost;
  uint is_match_model_index;
  node_state *cur_node_state;
  uint cur_node_state_index;
  uint match_len;
  dict_match *pMatches;
  uint len2_match_dist;
  uint num_full_matches;
  uint max_full_match_len;
  uint8 *pLookahead;
  uint lit_pred0;
  uint find_dict_size;
  uint max_admissable_match_len;
  node *pCur_node;
  node prev_lit_node;
  bit_cost_t lzdec_bitcosts [258];
  uint match_distances [128];
  uint match_lens [128];
  uint cur_node_index;
  uint cur_lookahead_ofs;
  uint cur_dict_ofs;
  uint lookahead_start_ofs;
  uint bytes_to_parse;
  node_state *first_node_state;
  state *approx_state;
  uint i;
  node *pNodes;
  int in_stack_fffffffffffff0d8;
  uint in_stack_fffffffffffff0dc;
  int in_stack_fffffffffffff0e0;
  undefined1 grow_hint;
  uint in_stack_fffffffffffff0e4;
  state *in_stack_fffffffffffff0e8;
  vector<lzham::lzcompressor::lzdecision> *this_00;
  node *in_stack_fffffffffffff0f0;
  search_accelerator *in_stack_fffffffffffff0f8;
  uint *in_stack_fffffffffffff108;
  uint in_stack_fffffffffffff110;
  uint in_stack_fffffffffffff114;
  uint in_stack_fffffffffffff118;
  uint in_stack_fffffffffffff11c;
  state *in_stack_fffffffffffff120;
  int in_stack_fffffffffffff128;
  uint in_stack_fffffffffffff12c;
  uint in_stack_fffffffffffff130;
  uint in_stack_fffffffffffff134;
  uint uVar6;
  undefined8 in_stack_fffffffffffff148;
  node *in_stack_fffffffffffff150;
  undefined8 in_stack_fffffffffffff158;
  uint in_stack_fffffffffffff160;
  uint local_e9c;
  uint local_e8c;
  ulong local_e88;
  lzdecision local_e80;
  int local_e74;
  long local_e70;
  bit_cost_t local_e68;
  lzdecision local_e60;
  int local_e54;
  long local_e50;
  uint *local_e48;
  int local_e3c;
  uint local_e38;
  uint local_e34;
  uint local_e30;
  uint local_e2c;
  uint local_e28;
  uint local_e24;
  bit_cost_t local_e20;
  lzdecision local_e14;
  uint local_e08;
  lzdecision local_e04;
  long local_df8;
  state *local_df0;
  uint local_de8;
  int local_de4;
  uchar *local_de0;
  uint local_dd4;
  uint local_dd0;
  uint local_dcc;
  uint local_dc8;
  uint local_dc4;
  uint local_dc0;
  uint local_dbc;
  long local_db8;
  int local_dac;
  uint *local_da8;
  uint local_da0;
  uint local_d9c;
  dict_match *local_d98;
  uint local_d8c;
  uint local_d88;
  uint local_d84;
  uchar *local_d80;
  uint local_d74;
  uint local_d70;
  uint local_d6c;
  uint *local_d68;
  undefined4 local_d60 [58];
  long local_c78 [258];
  uint auStack_468 [128];
  uint auStack_268 [131];
  uint local_5c;
  int local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint *local_48;
  state_base *local_40;
  uint local_34;
  uint *local_30;
  uint *local_28;
  bool local_11;
  undefined4 *local_10;
  uint *local_8;
  
  *(undefined1 *)((long)in_RSI + 0xb2a9a) = 0;
  *(undefined1 *)(in_RSI + 0x2caa6) = 1;
  local_30 = in_RSI + 0x1268;
  for (local_34 = 0; local_34 < 0xc01; local_34 = local_34 + 1) {
    local_8 = local_30 + (ulong)local_34 * 0x3a;
    *local_8 = 0;
  }
  local_40 = (state_base *)(in_RSI + 2);
  *local_30 = 1;
  local_48 = in_RSI + 0x126a;
  local_28 = in_RSI;
  state_base::save_partial_state(local_40,(state_base *)(in_RSI + 0x126d));
  *(undefined2 *)(local_48 + 0xd) = 0xffff;
  *(undefined1 *)((long)local_48 + 0x36) = 0xff;
  local_48[10] = 0;
  local_48[0xb] = 0;
  local_48[0xc] = 0;
  local_4c = local_28[1];
  uVar2 = search_accelerator::get_lookahead_pos
                    ((search_accelerator *)
                     &in_RDI->m_lit_table[0x22].super_raw_quasi_adaptive_huffman_data_model.
                      m_update_cycle);
  uVar3 = search_accelerator::get_max_dict_size_mask
                    ((search_accelerator *)
                     &in_RDI->m_lit_table[0x22].super_raw_quasi_adaptive_huffman_data_model.
                      m_update_cycle);
  local_50 = uVar2 & uVar3;
  local_54 = *local_28;
  local_58 = local_54 - local_50;
  local_5c = 0;
  node::node(in_stack_fffffffffffff0f0);
  local_10 = local_d60;
  local_d60[0] = 0;
  for (; local_5c < local_4c; local_5c = local_5c + 1) {
    local_d68 = local_30 + (ulong)local_5c * 0x3a;
    if (local_4c - local_5c < 0x102) {
      uVar6 = local_4c - local_5c;
    }
    else {
      uVar6 = 0x101;
    }
    local_d6c = uVar6;
    uVar3 = search_accelerator::get_cur_dict_size
                      ((search_accelerator *)
                       &in_RDI->m_lit_table[0x22].super_raw_quasi_adaptive_huffman_data_model.
                        m_update_cycle);
    local_d70 = uVar3 + local_58;
    local_d74 = state::get_pred_char
                          (in_stack_fffffffffffff0e8,
                           (search_accelerator *)
                           CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
                           in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8);
    local_d80 = vector<unsigned_char>::operator[]
                          ((vector<unsigned_char> *)
                           (in_RDI->m_lit_table[0x22].m_unused_alignment + 0x18),local_54);
    local_d84 = 0;
    local_d88 = 0;
    local_d8c = 0;
    if (1 < local_d6c) {
      local_d98 = search_accelerator::find_matches
                            (in_stack_fffffffffffff0f8,
                             (uint)((ulong)in_stack_fffffffffffff0f0 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff0f0 >> 0x18,0));
      if (local_d98 != (dict_match *)0x0) {
        while( true ) {
          uVar3 = dict_match::get_len(local_d98);
          in_stack_fffffffffffff134 = local_d6c;
          if (uVar3 < local_d6c) {
            in_stack_fffffffffffff134 = uVar3;
          }
          local_d9c = in_stack_fffffffffffff134;
          if (local_d84 < in_stack_fffffffffffff134) {
            auStack_268[local_d88] = in_stack_fffffffffffff134;
            local_d84 = in_stack_fffffffffffff134;
            uVar3 = dict_match::get_dist(local_d98);
            auStack_468[local_d88] = uVar3;
            local_d88 = local_d88 + 1;
          }
          bVar1 = dict_match::is_last(local_d98);
          if (bVar1) break;
          local_d98 = local_d98 + 1;
        }
      }
      local_d8c = search_accelerator::get_len2_match
                            (in_stack_fffffffffffff0f8,
                             (uint)((ulong)in_stack_fffffffffffff0f0 >> 0x20));
    }
    for (local_da0 = 0; local_da0 < *local_d68; local_da0 = local_da0 + 1) {
      local_da8 = local_d68 + (ulong)local_da0 * 0xe + 2;
      if (local_5c != 0) {
        state_base::restore_partial_state(local_40,(state_base *)(local_da8 + 3));
      }
      local_dac = (local_d74 >> 2) + local_40->m_cur_state * 0x40;
      local_db8 = *(long *)(local_da8 + 10);
      local_dbc = local_da8[0xc];
      local_dc0 = 0;
      local_dc4 = 1;
      for (local_dc8 = 0; local_dc8 < 4; local_dc8 = local_dc8 + 1) {
        local_dcc = 0;
        local_dd0 = local_40->m_match_hist[local_dc8];
        if (local_dd0 <= local_d70) {
          local_dd4 = (*(int *)(in_RDI->m_lit_table[0x22].m_unused_alignment + 0xc) + local_58) -
                      local_dd0 & *(uint *)(in_RDI->m_lit_table[0x22].m_unused_alignment + 8);
          local_de0 = vector<unsigned_char>::operator[]
                                ((vector<unsigned_char> *)
                                 (in_RDI->m_lit_table[0x22].m_unused_alignment + 0x18),local_dd4);
          for (local_dcc = 0;
              (local_dcc < local_d6c && (local_de0[local_dcc] == local_d80[local_dcc]));
              local_dcc = local_dcc + 1) {
          }
        }
        if (local_dc4 <= local_dcc) {
          local_dc0 = math::maximum<unsigned_int>(local_dc0,local_dcc);
          state::get_rep_match_costs
                    (in_RDI,uVar2,
                     (bit_cost_t *)CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
                     in_stack_fffffffffffff12c,in_stack_fffffffffffff128,
                     (int)((ulong)in_stack_fffffffffffff120 >> 0x20),(uint)in_stack_fffffffffffff150
                    );
          local_de4 = local_dbc + local_dc8 + 2;
          for (local_de8 = local_dc4; local_de8 <= local_dcc; local_de8 = local_de8 + 1) {
            in_stack_fffffffffffff120 = (state *)(local_d68 + (ulong)local_de8 * 0x3a);
            local_df8 = local_db8 + local_c78[local_de8];
            in_stack_fffffffffffff12c = local_5c;
            in_stack_fffffffffffff130 = local_da0;
            local_df0 = in_stack_fffffffffffff120;
            lzdecision::lzdecision(&local_e04,local_54,local_de8,-(local_dc8 + 1));
            node::add_state(in_stack_fffffffffffff150,
                            (int)((ulong)in_stack_fffffffffffff148 >> 0x20),
                            (int)in_stack_fffffffffffff148,(lzdecision *)in_RDI,
                            (state *)CONCAT44(uVar2,uVar6),
                            CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
                            in_stack_fffffffffffff160);
          }
        }
        local_dc4 = 2;
      }
      local_e08 = local_dc0;
      if (local_d8c != 0) {
        lzdecision::lzdecision(&local_e14,local_54,2,local_d8c);
        local_e20 = state::get_cost(in_RDI,(CLZBase *)CONCAT44(uVar2,uVar6),
                                    (search_accelerator *)
                                    CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
                                    (lzdecision *)
                                    CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
        node::add_state(in_stack_fffffffffffff150,(int)((ulong)in_stack_fffffffffffff148 >> 0x20),
                        (int)in_stack_fffffffffffff148,(lzdecision *)in_RDI,
                        (state *)CONCAT44(uVar2,uVar6),
                        CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
                        in_stack_fffffffffffff160);
        in_stack_fffffffffffff11c = local_e08;
        if (local_e08 < 2) {
          local_e08 = 2;
          in_stack_fffffffffffff11c = local_e08;
        }
      }
      if (local_e08 < local_d84) {
        in_stack_fffffffffffff118 = local_e08;
        if (local_e08 < 2) {
          in_stack_fffffffffffff118 = 1;
        }
        local_e24 = in_stack_fffffffffffff118;
        for (local_e28 = 0; local_e28 < local_d88; local_e28 = local_e28 + 1) {
          local_e2c = auStack_268[local_e28];
          if (local_e08 < local_e2c) {
            local_e30 = local_e24 + 1;
            local_e34 = auStack_468[local_e28];
            in_stack_fffffffffffff0e0 = local_dac;
            state::get_full_match_costs
                      (in_RDI,(CLZBase *)CONCAT44(uVar2,uVar6),in_stack_fffffffffffff134,
                       (bit_cost_t *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
                       (uint)((ulong)in_stack_fffffffffffff120 >> 0x20),
                       (int)in_stack_fffffffffffff120,(int)in_stack_fffffffffffff150,
                       (uint)in_stack_fffffffffffff158);
            for (local_e38 = local_e30; local_e38 <= local_e2c; local_e38 = local_e38 + 1) {
              local_e3c = 7;
              if (8 < local_e38) {
                local_e3c = 6;
              }
              in_stack_fffffffffffff108 = local_d68 + (ulong)local_e38 * 0x3a;
              local_e50 = local_db8 + local_c78[local_e38];
              local_e54 = local_dbc + local_e3c;
              in_stack_fffffffffffff110 = local_5c;
              in_stack_fffffffffffff114 = local_da0;
              local_e48 = in_stack_fffffffffffff108;
              lzdecision::lzdecision(&local_e60,local_54,local_e38,local_e34);
              node::add_state(in_stack_fffffffffffff150,
                              (int)((ulong)in_stack_fffffffffffff148 >> 0x20),
                              (int)in_stack_fffffffffffff148,(lzdecision *)in_RDI,
                              (state *)CONCAT44(uVar2,uVar6),
                              CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
                              in_stack_fffffffffffff160);
            }
            local_e24 = local_e2c;
          }
        }
      }
      local_e68 = state::get_lit_cost(in_stack_fffffffffffff120,
                                      (search_accelerator *)
                                      CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
                                      in_stack_fffffffffffff114,in_stack_fffffffffffff110,
                                      (uint)((ulong)in_stack_fffffffffffff108 >> 0x20));
      local_e70 = local_db8 + local_e68;
      local_e74 = local_dbc + 1;
      in_stack_fffffffffffff0f8 = (search_accelerator *)(local_d68 + 0x3a);
      lzdecision::lzdecision(&local_e80,local_54,0,0);
      in_stack_fffffffffffff0d8 = local_e74;
      node::add_state(in_stack_fffffffffffff150,(int)((ulong)in_stack_fffffffffffff148 >> 0x20),
                      (int)in_stack_fffffffffffff148,(lzdecision *)in_RDI,
                      (state *)CONCAT44(uVar2,uVar6),
                      CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130),
                      in_stack_fffffffffffff160);
    }
    local_54 = local_54 + 1;
    local_58 = local_58 + 1;
  }
  bVar1 = vector<lzham::lzcompressor::lzdecision>::try_reserve
                    ((vector<lzham::lzcompressor::lzdecision> *)
                     CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0),
                     in_stack_fffffffffffff0dc);
  grow_hint = (undefined1)((uint)in_stack_fffffffffffff0e0 >> 0x18);
  if (bVar1) {
    local_e88 = 0xffffffffffffffff;
    local_e8c = 0;
    for (local_e9c = 0; local_e9c < local_30[(ulong)local_4c * 0x3a]; local_e9c = local_e9c + 1) {
      if (*(ulong *)(local_30 + (ulong)local_4c * 0x3a + (ulong)local_e9c * 0xe + 0xc) < local_e88)
      {
        local_e88 = *(ulong *)(local_30 + (ulong)local_4c * 0x3a + (ulong)local_e9c * 0xe + 0xc);
        local_e8c = local_e9c;
      }
    }
    uVar2 = local_4c;
    plVar4 = vector<lzham::lzcompressor::lzdecision>::get_ptr
                       ((vector<lzham::lzcompressor::lzdecision> *)(local_28 + 0x2caa2));
    do {
      puVar5 = local_30 + (long)(int)uVar2 * 0x3a + (long)(int)local_e8c * 0xe + 2;
      uVar2 = puVar5[1];
      plVar4->m_pos = puVar5[0];
      plVar4->m_len = uVar2;
      plVar4->m_dist = puVar5[2];
      uVar2 = (uint)(short)puVar5[0xd];
      local_e8c = (uint)*(char *)((long)puVar5 + 0x36);
      plVar4 = plVar4 + 1;
    } while (0 < (int)uVar2);
    this_00 = (vector<lzham::lzcompressor::lzdecision> *)(local_28 + 0x2caa2);
    vector<lzham::lzcompressor::lzdecision>::get_ptr
              ((vector<lzham::lzcompressor::lzdecision> *)(local_28 + 0x2caa2));
    vector<lzham::lzcompressor::lzdecision>::try_resize
              (this_00,in_stack_fffffffffffff0e4,(bool)grow_hint);
    local_11 = true;
  }
  else {
    *(undefined1 *)((long)local_28 + 0xb2a9a) = 1;
    local_11 = false;
  }
  return local_11;
}

Assistant:

bool lzcompressor::extreme_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node *pNodes = parse_state.m_nodes;
      for (uint i = 0; i <= cMaxParseGraphNodes; i++)
      {
         pNodes[i].clear();
      }

      state &approx_state = parse_state.m_approx_state;

      pNodes[0].m_num_node_states = 1;
      node_state &first_node_state = pNodes[0].m_node_states[0];
      approx_state.save_partial_state(first_node_state.m_saved_state);
      first_node_state.m_parent_index = -1;
      first_node_state.m_parent_state_index = -1;
      first_node_state.m_total_cost = 0;
      first_node_state.m_total_complexity = 0;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      node prev_lit_node;
      prev_lit_node.clear();

      while (cur_node_index < bytes_to_parse)
      {
         node* pCur_node = &pNodes[cur_node_index];

         const uint max_admissable_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.get_cur_dict_size() + cur_lookahead_ofs;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // full matches
         uint max_full_match_len = 0;
         uint num_full_matches = 0;
         uint len2_match_dist = 0;

         if (max_admissable_match_len >= cMinMatchLen)
         {
            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_full_match_len)
                  {
                     max_full_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
         }

         for (uint cur_node_state_index = 0; cur_node_state_index < pCur_node->m_num_node_states; cur_node_state_index++)
         {
            node_state &cur_node_state = pCur_node->m_node_states[cur_node_state_index];

            if (cur_node_index)
            {
               LZHAM_ASSERT(cur_node_state.m_parent_index >= 0);

               approx_state.restore_partial_state(cur_node_state.m_saved_state);
            }

            uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, approx_state.m_cur_state);

            const bit_cost_t cur_node_total_cost = cur_node_state.m_total_cost;
            const uint cur_node_total_complexity = cur_node_state.m_total_complexity;

            // rep matches
            uint match_hist_max_len = 0;
            uint match_hist_min_match_len = 1;
            for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
            {
               uint hist_match_len = 0;

               uint dist = approx_state.m_match_hist[rep_match_index];
               if (dist <= find_dict_size)
               {
                  const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
                  const uint8* pComp = &m_accel.m_dict[comp_pos];

                  for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                     if (pComp[hist_match_len] != pLookahead[hist_match_len])
                        break;
               }

               if (hist_match_len >= match_hist_min_match_len)
               {
                  match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

                  approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

                  uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
                  for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
                  {
#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node& dst_node = pCur_node[l];

                     bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                     dst_node.add_state(cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, l, -((int)rep_match_index + 1)), approx_state, rep_match_total_cost, rep_match_total_complexity);
                  }
               }

               match_hist_min_match_len = cMinMatchLen;
            }

            uint min_truncate_match_len = match_hist_max_len;

            // nearest len2 match
            if (len2_match_dist)
            {
               lzdecision lzdec(cur_dict_ofs, 2, len2_match_dist);
               bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, lzdec);
               pCur_node[2].add_state(cur_node_index, cur_node_state_index, lzdec, approx_state, cur_node_total_cost + actual_cost, cur_node_total_complexity + cShortMatchComplexity);

               min_truncate_match_len = LZHAM_MAX(min_truncate_match_len, 2);
            }

            // full matches
            if (max_full_match_len > min_truncate_match_len)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint end_len = match_lens[full_match_index];
                  if (end_len <= min_truncate_match_len)
                     continue;

                  uint start_len = prev_max_match_len + 1;
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     dst_node.add_state( cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, l, match_dist), approx_state, match_total_cost, match_total_complexity);
                  }

                  prev_max_match_len = end_len;
               }
            }

            // literal
            bit_cost_t lit_cost = approx_state.get_lit_cost(m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
            bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
            uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
            {
               lzdecision actual_dec(cur_dict_ofs, 0, 0);
               bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
               LZHAM_ASSERT(actual_cost == lit_cost);
            }
#endif

            pCur_node[1].add_state( cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, 0, 0), approx_state, lit_total_cost, lit_total_complexity);

         } // cur_node_state_index

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;
      }

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_to_parse))
      {
         parse_state.m_failed = true;
         return false;
      }

      bit_cost_t lowest_final_cost = cBitCostMax; //math::cNearlyInfinite;
      int node_state_index = 0;
      node_state *pLast_node_states = pNodes[bytes_to_parse].m_node_states;
      for (uint i = 0; i < pNodes[bytes_to_parse].m_num_node_states; i++)
      {
         if (pLast_node_states[i].m_total_cost < lowest_final_cost)
         {
            lowest_final_cost = pLast_node_states[i].m_total_cost;
            node_state_index = i;
         }
      }

      int node_index = bytes_to_parse;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));

         node& cur_node = pNodes[node_index];
         const node_state &cur_node_state = cur_node.m_node_states[node_state_index];

         *pDst_dec++ = cur_node_state.m_lzdec;

         node_index = cur_node_state.m_parent_index;
         node_state_index = cur_node_state.m_parent_state_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      return true;
   }